

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AddTargetAlias
          (cmGlobalNinjaGenerator *this,string *alias,cmGeneratorTarget *target,string *config)

{
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  pointer __k;
  string *config2;
  _Alloc_hider __k_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>,_bool>
  pVar7;
  cmNinjaDeps outputs;
  string outputPath;
  TargetAlias ta;
  string buildAlias;
  cmNinjaDeps local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  local_e0;
  string local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  NinjaOutputPath(&local_98,this,alias);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
            (&local_50,this,&local_98,config);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = std::operator!=(config,"all");
  if (bVar3) {
    AppendTargetOutputs(this,target,&local_f8,config,DependOnTargetArtifact);
  }
  pbVar1 = local_f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
             ::operator[](&this->TargetAliases,__k);
    pmVar4->GeneratorTarget = (cmGeneratorTarget *)0x0;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
             ::operator[](&this->DefaultTargetAliases,__k);
    pmVar4->GeneratorTarget = (cmGeneratorTarget *)0x0;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e0,
               (cmMakefile *)
               (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
               IncludeEmptyConfig);
    sVar2 = local_e0.first._M_string_length;
    for (__k_00._M_p = local_e0.first._M_dataplus._M_p; __k_00._M_p != (pointer)sVar2;
        __k_00._M_p = __k_00._M_p + 0x20) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
               ::operator[](&this->Configs,(key_type *)__k_00._M_p);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
               ::operator[](&pmVar5->TargetAliases,__k);
      pmVar4->GeneratorTarget = (cmGeneratorTarget *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e0);
  }
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_78 = (undefined1  [8])target;
  std::__cxx11::string::_M_assign((string *)&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
            (&local_e0,&local_50,(TargetAlias *)local_78);
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&this->TargetAliases,&local_e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::~pair(&local_e0);
  if ((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (*(cmGeneratorTarget **)(pVar7.first._M_node._M_node + 2) != target)) {
    *(undefined8 *)(pVar7.first._M_node._M_node + 2) = 0;
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
            (&local_e0,&local_98,(TargetAlias *)local_78);
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&pmVar5->TargetAliases,&local_e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::~pair(&local_e0);
  if ((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (*(cmGeneratorTarget **)(pVar7.first._M_node._M_node + 2) != target)) {
    *(undefined8 *)(pVar7.first._M_node._M_node + 2) = 0;
  }
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->DefaultConfigs,config);
  if (sVar6 != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
              (&local_e0,&local_98,(TargetAlias *)local_78);
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                        *)&this->DefaultTargetAliases,&local_e0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
    ::~pair(&local_e0);
    if ((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (*(cmGeneratorTarget **)(pVar7.first._M_node._M_node + 2) != target)) {
      *(undefined8 *)(pVar7.first._M_node._M_node + 2) = 0;
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddTargetAlias(const std::string& alias,
                                            cmGeneratorTarget* target,
                                            const std::string& config)
{
  std::string outputPath = this->NinjaOutputPath(alias);
  std::string buildAlias = this->BuildAlias(outputPath, config);
  cmNinjaDeps outputs;
  if (config != "all") {
    this->AppendTargetOutputs(target, outputs, config, DependOnTargetArtifact);
  }
  // Mark the target's outputs as ambiguous to ensure that no other target
  // uses the output as an alias.
  for (std::string const& output : outputs) {
    this->TargetAliases[output].GeneratorTarget = nullptr;
    this->DefaultTargetAliases[output].GeneratorTarget = nullptr;
    for (const std::string& config2 :
         this->Makefiles.front()->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->Configs[config2].TargetAliases[output].GeneratorTarget = nullptr;
    }
  }

  // Insert the alias into the map.  If the alias was already present in the
  // map and referred to another target, mark it as ambiguous.
  TargetAlias ta;
  ta.GeneratorTarget = target;
  ta.Config = config;

  auto newAliasGlobal =
    this->TargetAliases.insert(std::make_pair(buildAlias, ta));
  if (newAliasGlobal.second &&
      newAliasGlobal.first->second.GeneratorTarget != target) {
    newAliasGlobal.first->second.GeneratorTarget = nullptr;
  }

  auto newAliasConfig =
    this->Configs[config].TargetAliases.insert(std::make_pair(outputPath, ta));
  if (newAliasConfig.second &&
      newAliasConfig.first->second.GeneratorTarget != target) {
    newAliasConfig.first->second.GeneratorTarget = nullptr;
  }
  if (this->DefaultConfigs.count(config)) {
    auto newAliasDefaultGlobal =
      this->DefaultTargetAliases.insert(std::make_pair(outputPath, ta));
    if (newAliasDefaultGlobal.second &&
        newAliasDefaultGlobal.first->second.GeneratorTarget != target) {
      newAliasDefaultGlobal.first->second.GeneratorTarget = nullptr;
    }
  }
}